

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O3

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO
          (FBOCache *this,TextureBaseGL *pTex,Uint32 ArraySlice,Uint32 MipLevel,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  __int_type_conflict1 _Var1;
  int iVar2;
  GLenum Status;
  long lVar3;
  long lVar4;
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  _Var5;
  TextureFormatAttribs *pTVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar9;
  string msg;
  GLenum err;
  GLFrameBufferObj NewFBO;
  string local_218;
  char *local_1f8;
  GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> local_1ec;
  undefined8 local_1e0;
  key_type local_1d8;
  
  lVar3 = (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                             .super_ObjectBase<Diligent::ITextureGL>.
                             super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.
                             super_ITexture.super_IDeviceObject + 0x20))(pTex);
  local_1d8.RTIds[5] = 0;
  local_1d8.RTIds[6] = 0;
  local_1d8.RTIds[7] = 0;
  local_1d8.RTIds[1] = 0;
  local_1d8.RTIds[2] = 0;
  local_1d8.RTIds[3] = 0;
  local_1d8.RTIds[4] = 0;
  lVar4 = 0x28;
  do {
    *(undefined8 *)((long)local_1d8.RTIds + lVar4 + 0xc) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar4 + 0x14) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar4 + -4) = 0;
    *(undefined8 *)((long)local_1d8.RTIds + lVar4 + 4) = 0;
    *(undefined2 *)((long)local_1d8.RTIds + lVar4 + 0x1c) = 0;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x168);
  local_1d8.DSId = 0;
  local_1d8.DSVDesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  local_1d8.DSVDesc.ViewType = TEXTURE_VIEW_UNDEFINED;
  local_1d8.DSVDesc.TextureDim = RESOURCE_DIM_UNDEFINED;
  local_1d8.DSVDesc.Format = TEX_FORMAT_UNKNOWN;
  local_1d8.DSVDesc.MostDetailedMip = 0;
  local_1d8.DSVDesc.NumMipLevels = 0;
  local_1d8.DSVDesc.field_5 = (anon_union_4_2_fd7742d7_for_TextureViewDesc_6)0x0;
  local_1d8.DSVDesc.field_6 = (anon_union_4_2_468fdb0b_for_TextureViewDesc_8)0x0;
  local_1d8.DSVDesc.AccessFlags = UAV_ACCESS_UNSPECIFIED;
  local_1d8.DSVDesc.Flags = TEXTURE_VIEW_FLAG_NONE;
  local_1d8.DSVDesc.Swizzle.R = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.G = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.B = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.DSVDesc.Swizzle.A = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  local_1d8.Width = 0;
  local_1d8.Height = 0;
  local_1d8.Hash = 0;
  local_1d8.NumRenderTargets = 1;
  local_1d8.RTIds[0] =
       DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
       GetUniqueID((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                    *)pTex);
  local_1d8.RTVDescs[0].Format = *(TEXTURE_FORMAT *)(lVar3 + 0x18);
  local_1d8.RTVDescs[0].TextureDim = *(RESOURCE_DIMENSION *)(lVar3 + 8);
  local_1d8.RTVDescs[0].ViewType =
       TEXTURE_VIEW_RENDER_TARGET -
       ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) == FRAMEBUFFER_TARGET_FLAG_NONE);
  local_1d8.RTVDescs[0].field_6.NumArraySlices = 1;
  local_1d8.RTVDescs[0].MostDetailedMip = MipLevel;
  local_1d8.RTVDescs[0].field_5.FirstArraySlice = ArraySlice;
  while( true ) {
    LOCK();
    _Var1 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
    (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) break;
    Threading::SpinLock::Wait(&this->m_CacheLock);
  }
  _Var5._M_cur = (__node_type *)
                 std::
                 _Hashtable<Diligent::FBOCache::FBOCacheKey,_std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->m_Cache)._M_h,&local_1d8);
  if (_Var5._M_cur == (__node_type *)0x0) {
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::GLObjWrapper
              (&local_1ec,true,(GLFBOCreateReleaseHelper)0x0);
    local_1e0 = 0xffffffff;
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      (*__glewBindFramebuffer)(0x8ca8,local_1ec.m_uiHandle);
      iVar2 = glGetError();
      local_1f8 = (char *)CONCAT44(local_1f8._4_4_,iVar2);
      if (iVar2 != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171,(char (*) [43])"Failed to bind new FBO as read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)&local_1f8);
        FormatString<char[6]>(&local_218,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  (local_218._M_dataplus._M_p,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      (*__glewBindFramebuffer)(0x8ca9,local_1ec.m_uiHandle);
      iVar2 = glGetError();
      local_1f8 = (char *)CONCAT44(local_1f8._4_4_,iVar2);
      if (iVar2 != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176,(char (*) [43])"Failed to bind new FBO as draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)&local_1f8);
        FormatString<char[6]>(&local_218,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  (local_218._M_dataplus._M_p,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pTVar6 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(lVar3 + 0x18));
    uVar8 = 0x8ce0;
    if (pTVar6->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
      uVar8 = 0x821a;
    }
    uVar7 = 0x8d00;
    if (pTVar6->ComponentType != COMPONENT_TYPE_DEPTH) {
      uVar7 = uVar8;
    }
    (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .super_ObjectBase<Diligent::ITextureGL>.
                       super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.super_ITexture.
                       super_IDeviceObject + 0x98))(pTex,local_1d8.RTVDescs,uVar7,Targets);
    Status = (*__glewCheckFramebufferStatus)(0x8ca8);
    if (Status != 0x8cd5) {
      local_1f8 = GetFramebufferStatusString(Status);
      LogError<false,char[44],char_const*>
                (false,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x180,(char (*) [44])"Read framebuffer is incomplete. FB status: ",&local_1f8);
      FormatString<char[31]>(&local_218,(char (*) [31])"Read framebuffer is incomplete");
      DebugAssertionFailed
                (local_218._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x181);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    pVar9 = std::
            _Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((_Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Cache,&local_1d8,&local_1ec);
    _Var5._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                   ._M_cur;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>(&local_218,(char (*) [25])"New FBO was not inserted");
      DebugAssertionFailed
                (local_218._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x187);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Hashtable<int,std::pair<int_const,Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<int&,Diligent::FBOCache::FBOCacheKey&>
              ((_Hashtable<int,std::pair<int_const,Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&this->m_TexIdToKey,0,local_1d8.RTIds,&local_1d8);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&local_1ec);
  }
  Threading::SpinLock::unlock(&this->m_CacheLock);
  return (GLFrameBufferObj *)
         ((long)&((_Var5._M_cur)->
                 super__Hash_node_value<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>
                 ._M_storage._M_storage + 0x1a8);
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(TextureBaseGL*                          pTex,
                                                           Uint32                                  ArraySlice,
                                                           Uint32                                  MipLevel,
                                                           TextureBaseGL::FRAMEBUFFER_TARGET_FLAGS Targets)
{
    const TextureDesc& TexDesc = pTex->GetDesc();

    FBOCacheKey Key;
    Key.NumRenderTargets = 1;
    Key.RTIds[0]         = pTex->GetUniqueID();

    TextureViewDesc& RTV0{Key.RTVDescs[0]};
    RTV0.Format     = TexDesc.Format;
    RTV0.TextureDim = TexDesc.Type;
    RTV0.ViewType   = (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW) ?
        TEXTURE_VIEW_RENDER_TARGET : // Also OK for depth attachments
        TEXTURE_VIEW_SHADER_RESOURCE;

    RTV0.FirstArraySlice = ArraySlice;
    RTV0.MostDetailedMip = MipLevel;
    RTV0.NumArraySlices  = 1;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO{true};

        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glBindFramebuffer(GL_READ_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as read framebuffer");
        }
        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            glBindFramebuffer(GL_DRAW_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as draw framebuffer");
        }

        pTex->AttachToFramebuffer(RTV0, GetFramebufferAttachmentPoint(TexDesc.Format), Targets);

#ifdef DILIGENT_DEVELOPMENT
        GLenum Status = glCheckFramebufferStatus(GL_READ_FRAMEBUFFER);
        if (Status != GL_FRAMEBUFFER_COMPLETE)
        {
            const Char* StatusString = GetFramebufferStatusString(Status);
            LOG_ERROR("Read framebuffer is incomplete. FB status: ", StatusString);
            UNEXPECTED("Read framebuffer is incomplete");
        }
#endif

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        m_TexIdToKey.emplace(Key.RTIds[0], Key);

        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}